

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCreateCharEncodingHandler
              (char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
              xmlCharEncodingHandler **out)

{
  xmlCharEncoding xVar1;
  int iVar2;
  char *name_00;
  
  iVar2 = 0x73;
  if ((out != (xmlCharEncodingHandler **)0x0) &&
     (*out = (xmlCharEncodingHandler *)0x0, name != (char *)0x0)) {
    name_00 = xmlGetEncodingAlias(name);
    if (name_00 == (char *)0x0) {
      name_00 = name;
    }
    xVar1 = xmlParseCharEncodingInternal(name_00);
    iVar2 = 0;
    if (xVar1 != XML_CHAR_ENCODING_UTF8) {
      if ((0x1d < (uint)(xVar1 + XML_CHAR_ENCODING_ERROR)) ||
         (*(long *)((ulong)(uint)xVar1 * 0x48 + 0x208a58 + (ulong)(output != 0) * 8) == 0)) {
        iVar2 = xmlFindExtraHandler(name,name_00,output,impl,implCtxt,out);
        return iVar2;
      }
      *out = defaultHandlers + (uint)xVar1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlCreateCharEncodingHandler(const char *name, int output,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if (name == NULL)
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((output ? handler->output : handler->input) != NULL) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, output, impl, implCtxt, out));
}